

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  undefined8 uVar6;
  REF_INT node;
  long lVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  REF_DICT ref_dict;
  int local_134;
  FILE *local_130;
  REF_GRID local_128;
  uint local_120;
  REF_INT local;
  REF_NODE local_118;
  REF_DBL area_sign;
  REF_DBL uv [2];
  REF_DBL n [3];
  REF_INT nodes [27];
  REF_DBL s [3];
  REF_DBL r [3];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  local_130 = (FILE *)file;
  uVar4 = ref_dict_create(&ref_dict);
  if (uVar4 == 0) {
    lVar10 = 0;
    local_128 = ref_grid;
    local_118 = pRVar1;
    for (lVar7 = 0; lVar7 < ref_geom->max; lVar7 = lVar7 + 1) {
      pRVar2 = ref_geom->descr;
      if (((*(int *)((long)pRVar2 + lVar10) == 2) && (*(int *)((long)pRVar2 + lVar10 + 4) == id)) &&
         (uVar4 = ref_dict_store(ref_dict,*(REF_INT *)((long)pRVar2 + lVar10 + 0x14),(REF_INT)lVar7)
         , uVar4 != 0)) {
        pcVar8 = "mark nodes";
        uVar6 = 0xd6f;
        goto LAB_0015d2aa;
      }
      lVar10 = lVar10 + 0x18;
    }
    local_120 = ref_dict->n;
    uVar4 = 0;
    for (iVar9 = 0; iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
      RVar5 = ref_cell_nodes(ref_cell,iVar9,nodes);
      uVar4 = uVar4 + (nodes[3] == id && RVar5 == 0);
    }
    if ((local_120 == 0) || (uVar4 == 0)) {
      uVar4 = ref_dict_free(ref_dict);
      if (uVar4 == 0) {
        return 0;
      }
      pcVar8 = "free dict";
      uVar6 = 0xd7d;
    }
    else {
      fprintf(local_130,"zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",id
              ,(ulong)local_120,(ulong)uVar4,"point","fetriangle");
      iVar9 = ref_dict->n;
      local_134 = -1;
      node = -1;
      if (0 < iVar9) {
        node = *ref_dict->key;
        local_134 = *ref_dict->value;
      }
      for (lVar7 = 1; lVar7 + -1 < (long)iVar9; lVar7 = lVar7 + 1) {
        uVar4 = ref_geom_find(ref_geom,node,2,id,&local_134);
        if (uVar4 != 0) {
          pcVar8 = "not found";
          uVar6 = 0xd87;
          goto LAB_0015d2aa;
        }
        uv[0] = ref_geom->param[(long)local_134 * 2];
        uv[1] = ref_geom->param[local_134 * 2 + 1];
        uVar4 = ref_geom_face_rsn(ref_geom,id,uv,r,s,n);
        if (uVar4 != 0) {
          pcVar8 = "rsn";
          uVar6 = 0xd8a;
          goto LAB_0015d2aa;
        }
        uVar4 = ref_geom_uv_area_sign(local_128,id,&area_sign);
        if (uVar4 != 0) {
          pcVar8 = "a sign";
          uVar6 = 0xd8b;
          goto LAB_0015d2aa;
        }
        pRVar3 = local_118->real;
        lVar10 = (long)(node * 0xf);
        dVar11 = -area_sign;
        fprintf(local_130," %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar3[lVar10],pRVar3[lVar10 + 1]
                ,pRVar3[lVar10 + 2],n[0] * dVar11,n[1] * dVar11,dVar11 * n[2]);
        iVar9 = ref_dict->n;
        node = -1;
        local_134 = -1;
        if ((int)lVar7 < iVar9) {
          node = ref_dict->key[lVar7];
          local_134 = ref_dict->value[lVar7];
        }
      }
      iVar9 = 0;
      while (iVar9 < ref_cell->max) {
        local_128 = (REF_GRID)CONCAT44(local_128._4_4_,iVar9);
        RVar5 = ref_cell_nodes(ref_cell,iVar9,nodes);
        if ((RVar5 == 0) && (nodes[3] == id)) {
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            uVar4 = ref_dict_location(ref_dict,nodes[lVar7],&local);
            if (uVar4 != 0) {
              pcVar8 = "localize";
              uVar6 = 0xd95;
              goto LAB_0015d2aa;
            }
            fprintf(local_130," %d",(ulong)(local + 1));
          }
          fputc(10,local_130);
        }
        iVar9 = (int)local_128 + 1;
      }
      uVar4 = ref_dict_free(ref_dict);
      if (uVar4 == 0) {
        return 0;
      }
      pcVar8 = "free dict";
      uVar6 = 0xd9c;
    }
  }
  else {
    pcVar8 = "create dict";
    uVar6 = 0xd6a;
  }
LAB_0015d2aa:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
         "ref_geom_norm_tec_zone",(ulong)uVar4,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, ntri;
  REF_DBL r[3], s[3], n[3], uv[2];
  REF_DBL area_sign;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
    }
  }
  nnode = ref_dict_n(ref_dict);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    RSS(ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom), "not found");
    uv[0] = ref_geom_param(ref_geom, 0, geom);
    uv[1] = ref_geom_param(ref_geom, 1, geom);
    RSS(ref_geom_face_rsn(ref_geom, id, uv, r, s, n), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e\n",
            ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
            ref_node_xyz(ref_node, 2, node), -area_sign * n[0],
            -area_sign * n[1], -area_sign * n[2]);
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      for (node = 0; node < 3; node++) {
        RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}